

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::
     verifyRecursive<int>
               (AtomicOperation operation,int index,int valueSoFar,bool (*argsUsed) [5],
               int (*args) [5],int (*returnValues) [5])

{
  bool bVar1;
  int valueSoFar_00;
  int local_34;
  int i;
  int (*returnValues_local) [5];
  int (*args_local) [5];
  bool (*argsUsed_local) [5];
  int valueSoFar_local;
  int index_local;
  AtomicOperation operation_local;
  
  if (index < 5) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      if ((((*argsUsed)[local_34] & 1U) == 0) &&
         (bVar1 = compare((*returnValues)[local_34],valueSoFar), bVar1)) {
        (*argsUsed)[local_34] = true;
        valueSoFar_00 = computeBinaryAtomicOperationResult(operation,valueSoFar,(*args)[local_34]);
        bVar1 = verifyRecursive<int>(operation,index + 1,valueSoFar_00,argsUsed,args,returnValues);
        if (bVar1) {
          return true;
        }
        (*argsUsed)[local_34] = false;
      }
    }
    index_local._3_1_ = false;
  }
  else {
    index_local._3_1_ = true;
  }
  return index_local._3_1_;
}

Assistant:

static bool verifyRecursive (AtomicOperation operation, int index, T valueSoFar, bool (&argsUsed)[NUM_INVOCATIONS_PER_PIXEL], const T (&args)[NUM_INVOCATIONS_PER_PIXEL], const T (&returnValues)[NUM_INVOCATIONS_PER_PIXEL])
	{
		if (index < NUM_INVOCATIONS_PER_PIXEL)
		{
			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				if (!argsUsed[i] && compare(returnValues[i], valueSoFar))
				{
					argsUsed[i] = true;
					if (verifyRecursive(operation, index+1, computeBinaryAtomicOperationResult(operation, valueSoFar, args[i]), argsUsed, args, returnValues))
						return true;
					argsUsed[i] = false;
				}
			}

			return false;
		}
		else
			return true;
	}